

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

void BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,BrotliEncoderParams *params,HasherHandle hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  float *pfVar1;
  undefined4 *puVar2;
  float *pfVar3;
  float fVar4;
  ulong max_backward_limit;
  ushort uVar5;
  ushort uVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  int iVar13;
  uint uVar14;
  void *__dest;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  StartPosQueue *queue;
  size_t sVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  void *pvVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  uint8_t *puVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  uint8_t *puVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  bool bVar41;
  float fVar42;
  float fVar43;
  ZopfliNode *nodes;
  undefined4 *local_27d8;
  ulong local_27c8;
  ulong local_27b0;
  void *local_2798;
  void *local_2770;
  ulong local_2760;
  ulong local_2748;
  ulong local_2740;
  int orig_dist_cache [4];
  ZopfliCostModel model;
  uint32_t histogram_literal [256];
  uint32_t histogram_cmd [704];
  float cost_literal [256];
  uint32_t histogram_dist [544];
  
  iVar13 = params->lgwin;
  if (num_bytes == 0) {
    local_2770 = (void *)0x0;
  }
  else {
    local_2770 = BrotliAllocate(m,num_bytes * 4);
  }
  local_2740 = num_bytes * 4;
  local_2798 = (void *)0x0;
  pvVar25 = (void *)(num_bytes - 0x7f);
  if (num_bytes < 0x7f) {
    pvVar25 = local_2798;
  }
  if (local_2740 != 0) {
    local_2798 = BrotliAllocate(m,num_bytes << 5);
  }
  max_backward_limit = (1L << ((byte)iVar13 & 0x3f)) - 0x10;
  if (3 < num_bytes) {
    lVar38 = 0;
    lVar20 = 0;
    do {
      uVar21 = position + lVar38;
      uVar23 = max_backward_limit;
      if (uVar21 < max_backward_limit) {
        uVar23 = uVar21;
      }
      uVar15 = lVar20 + 0x80;
      if (local_2740 < uVar15) {
        uVar22 = local_2740;
        if (local_2740 == 0) {
          uVar22 = uVar15;
        }
        do {
          uVar27 = uVar22;
          uVar22 = uVar27 * 2;
        } while (uVar27 < uVar15);
        if (uVar27 == 0) {
          __dest = (void *)0x0;
        }
        else {
          __dest = BrotliAllocate(m,uVar27 * 8);
        }
        if (local_2740 != 0) {
          memcpy(__dest,local_2798,local_2740 << 3);
        }
        BrotliFree(m,local_2798);
        local_2798 = __dest;
        local_2740 = uVar27;
      }
      uVar27 = num_bytes - lVar38;
      uVar22 = uVar21 & ringbuffer_mask;
      uVar15 = 0x10;
      if (params->quality == 0xb) {
        uVar15 = 0x40;
      }
      uVar16 = 0;
      if (uVar15 <= uVar21) {
        uVar16 = uVar21 - uVar15;
      }
      puVar2 = (undefined4 *)((long)local_2798 + lVar20 * 8);
      puVar31 = ringbuffer + uVar22;
      uVar17 = (ulong)((uint)uVar27 & 7);
      uVar33 = 1;
      uVar15 = uVar21;
      local_27d8 = puVar2;
      do {
        uVar15 = uVar15 - 1;
        if ((uVar15 <= uVar16) || (2 < uVar33)) break;
        uVar26 = uVar21 - uVar15;
        if ((uVar26 <= uVar23) &&
           ((uVar39 = uVar15 & ringbuffer_mask, *puVar31 == ringbuffer[uVar39] &&
            (puVar31[1] == ringbuffer[uVar39 + 1])))) {
          if (7 < uVar27) {
            lVar35 = 0;
            uVar28 = 0;
LAB_0010cec3:
            if (*(ulong *)(puVar31 + uVar28 * 8) == *(ulong *)(ringbuffer + uVar28 * 8 + uVar39))
            goto code_r0x0010ced0;
            uVar28 = *(ulong *)(ringbuffer + uVar28 * 8 + uVar39) ^ *(ulong *)(puVar31 + uVar28 * 8)
            ;
            uVar39 = 0;
            if (uVar28 != 0) {
              for (; (uVar28 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar28 = (uVar39 >> 3 & 0x1fffffff) - lVar35;
            goto LAB_0010cf08;
          }
          puVar36 = puVar31;
          uVar37 = 0;
LAB_0010cf40:
          uVar28 = uVar37;
          if (uVar17 != 0) {
            uVar29 = uVar17 | uVar37;
            uVar30 = uVar17;
            do {
              uVar28 = uVar37;
              if (ringbuffer[uVar37 + uVar39] != *puVar36) break;
              puVar36 = puVar36 + 1;
              uVar37 = uVar37 + 1;
              uVar30 = uVar30 - 1;
              uVar28 = uVar29;
            } while (uVar30 != 0);
          }
LAB_0010cf08:
          if (uVar33 < uVar28) {
            *local_27d8 = (int)uVar26;
            local_27d8[1] = (int)uVar28 << 5;
            local_27d8 = local_27d8 + 2;
            uVar33 = uVar28;
          }
        }
      } while (uVar26 <= uVar23);
      if (uVar33 < uVar27) {
        uVar16 = (ulong)((uint)(*(int *)(ringbuffer + uVar22) * 0x1e35a7bd) >> 0xf);
        uVar17 = (ulong)*(uint *)(hasher + uVar16 * 4 + 0x30);
        uVar15 = uVar27;
        if (0x7f < uVar27) {
          *(int *)(hasher + uVar16 * 4 + 0x30) = (int)uVar21;
          uVar15 = 0x80;
        }
        uVar16 = *(ulong *)(hasher + 0x28);
        lVar35 = (uVar16 & uVar21) * 2 + 1;
        lVar40 = (uVar16 & uVar21) * 2;
        lVar32 = 0x40;
        local_2760 = 0;
        local_2748 = 0;
LAB_0010d00e:
        uVar26 = uVar21 - uVar17;
        if ((uVar26 != 0) && (lVar32 != 0 && uVar26 <= uVar23)) {
          uVar39 = local_2748;
          if (local_2760 < local_2748) {
            uVar39 = local_2760;
          }
          puVar31 = ringbuffer + uVar39 + (uVar17 & ringbuffer_mask);
          uVar28 = uVar27 - uVar39;
          if (7 < uVar28) {
            uVar30 = uVar28 & 0xfffffffffffffff8;
            lVar34 = 0;
            uVar37 = 0;
LAB_0010d0bd:
            if (*(ulong *)(puVar31 + uVar37 * 8) ==
                *(ulong *)(ringbuffer + uVar37 * 8 + uVar39 + uVar22)) goto code_r0x0010d0ca;
            uVar37 = *(ulong *)(ringbuffer + uVar37 * 8 + uVar39 + uVar22) ^
                     *(ulong *)(puVar31 + uVar37 * 8);
            uVar28 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
              }
            }
            uVar37 = (uVar28 >> 3 & 0x1fffffff) - lVar34;
            goto LAB_0010d11a;
          }
          uVar30 = 0;
          goto LAB_0010d22b;
        }
        if (0x7f < uVar27) {
          *(undefined4 *)(hasher + lVar40 * 4 + 0x80038) = *(undefined4 *)(hasher + 0x80030);
          uVar12 = *(undefined4 *)(hasher + 0x80030);
          goto LAB_0010d04c;
        }
        goto LAB_0010d054;
      }
LAB_0010d26c:
      lVar35 = 0;
      do {
        model.cost_cmd_[lVar35] = 2.5243547e-29;
        lVar35 = lVar35 + 1;
      } while (lVar35 != 0x26);
      uVar33 = uVar33 + 1;
      if (uVar33 < 5) {
        uVar33 = 4;
      }
      iVar13 = BrotliFindAllStaticDictionaryMatches
                         (&params->dictionary,ringbuffer + uVar22,uVar33,uVar27,(uint32_t *)&model);
      if (iVar13 != 0) {
        if (0x24 < uVar27) {
          uVar27 = 0x25;
        }
        if (uVar33 <= uVar27) {
          iVar13 = (int)uVar33 << 5;
          do {
            fVar42 = model.cost_cmd_[uVar33];
            if (((uint)fVar42 < 0xfffffff) &&
               (uVar15 = (ulong)((uint)fVar42 >> 5) + uVar23 + 1,
               uVar15 <= (params->dist).max_distance)) {
              uVar19 = (uint)fVar42 & 0x1f;
              *local_27d8 = (int)uVar15;
              if (uVar33 == uVar19) {
                uVar19 = 0;
              }
              local_27d8[1] = uVar19 + iVar13;
              local_27d8 = local_27d8 + 2;
            }
            uVar33 = uVar33 + 1;
            iVar13 = iVar13 + 0x20;
          } while (uVar27 + 1 != uVar33);
        }
      }
      lVar32 = (long)local_27d8 - (long)puVar2 >> 3;
      *(int *)((long)local_2770 + lVar38 * 4) = (int)lVar32;
      lVar35 = lVar20;
      lVar40 = lVar38;
      if (local_27d8 != puVar2) {
        lVar35 = lVar32 + lVar20;
        uVar19 = *(uint *)((long)local_2798 + lVar35 * 8 + -4);
        if (0x28bf < uVar19) {
          uVar22 = (ulong)(uVar19 >> 5);
          uVar23 = uVar21 + 1;
          uVar15 = uVar22 + uVar21;
          if ((long)pvVar25 + position <= uVar15) {
            uVar15 = (long)pvVar25 + position;
          }
          uVar27 = uVar15 - 0x3f;
          if (uVar15 < uVar21 + 0x40) {
            uVar27 = uVar23;
          }
          *(undefined8 *)((long)local_2798 + lVar20 * 8) =
               *(undefined8 *)((long)local_2798 + lVar35 * 8 + -8);
          *(undefined4 *)((long)local_2770 + lVar38 * 4) = 1;
          if ((uVar21 + 0x201 <= uVar27) && (uVar23 < uVar27)) {
            uVar21 = *(ulong *)(hasher + 0x28);
LAB_0010d41d:
            uVar17 = uVar23 & ringbuffer_mask;
            uVar26 = (ulong)((uint)(*(int *)(ringbuffer + uVar17) * 0x1e35a7bd) >> 0xf);
            uVar39 = (ulong)*(uint *)(hasher + uVar26 * 4 + 0x30);
            uVar16 = (uVar21 & uVar23) * 2 + 1;
            uVar33 = (uVar21 & uVar23) * 2;
            *(int *)(hasher + uVar26 * 4 + 0x30) = (int)uVar23;
            lVar35 = 0x40;
            local_27b0 = 0;
            local_27c8 = 0;
LAB_0010d46c:
            if ((uVar23 != uVar39) && (lVar35 != 0 && uVar23 - uVar39 <= uVar21 - 0xf)) {
              uVar26 = local_27c8;
              if (local_27b0 < local_27c8) {
                uVar26 = local_27b0;
              }
              puVar31 = ringbuffer + uVar26 + (uVar39 & ringbuffer_mask);
              uVar28 = 0x80 - uVar26;
              if (7 < uVar28) {
                uVar30 = uVar28 & 0xfffffffffffffff8;
                lVar40 = 0;
                uVar37 = 0;
LAB_0010d511:
                if (*(ulong *)(puVar31 + uVar37 * 8) ==
                    *(ulong *)(ringbuffer + uVar37 * 8 + uVar26 + uVar17)) goto code_r0x0010d51e;
                uVar37 = *(ulong *)(ringbuffer + uVar37 * 8 + uVar26 + uVar17) ^
                         *(ulong *)(puVar31 + uVar37 * 8);
                uVar28 = 0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                  }
                }
                uVar37 = (uVar28 >> 3 & 0x1fffffff) - lVar40;
                goto LAB_0010d56a;
              }
              uVar30 = 0;
              goto LAB_0010d60a;
            }
            *(undefined4 *)(hasher + uVar33 * 4 + 0x80038) = *(undefined4 *)(hasher + 0x80030);
            uVar12 = *(undefined4 *)(hasher + 0x80030);
            goto LAB_0010d49f;
          }
LAB_0010d64b:
          if (uVar27 < uVar15) {
            uVar23 = *(ulong *)(hasher + 0x28);
LAB_0010d664:
            uVar33 = uVar27 & ringbuffer_mask;
            uVar17 = (ulong)((uint)(*(int *)(ringbuffer + uVar33) * 0x1e35a7bd) >> 0xf);
            uVar26 = (ulong)*(uint *)(hasher + uVar17 * 4 + 0x30);
            uVar21 = (uVar23 & uVar27) * 2 + 1;
            uVar16 = (uVar23 & uVar27) * 2;
            *(int *)(hasher + uVar17 * 4 + 0x30) = (int)uVar27;
            lVar35 = 0x40;
            local_27b0 = 0;
            local_27c8 = 0;
LAB_0010d6b3:
            if ((uVar27 != uVar26) && (lVar35 != 0 && uVar27 - uVar26 <= uVar23 - 0xf)) {
              uVar17 = local_27c8;
              if (local_27b0 < local_27c8) {
                uVar17 = local_27b0;
              }
              puVar31 = ringbuffer + uVar17 + (uVar26 & ringbuffer_mask);
              uVar39 = 0x80 - uVar17;
              if (7 < uVar39) {
                uVar28 = uVar39 & 0xfffffffffffffff8;
                lVar40 = 0;
                uVar37 = 0;
LAB_0010d757:
                if (*(ulong *)(puVar31 + uVar37 * 8) ==
                    *(ulong *)(ringbuffer + uVar37 * 8 + uVar17 + uVar33)) goto code_r0x0010d764;
                uVar28 = *(ulong *)(ringbuffer + uVar37 * 8 + uVar17 + uVar33) ^
                         *(ulong *)(puVar31 + uVar37 * 8);
                uVar39 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar37 = (uVar39 >> 3 & 0x1fffffff) - lVar40;
                goto LAB_0010d7af;
              }
              uVar28 = 0;
              goto LAB_0010d843;
            }
            *(undefined4 *)(hasher + uVar16 * 4 + 0x80038) = *(undefined4 *)(hasher + 0x80030);
            uVar12 = *(undefined4 *)(hasher + 0x80030);
            goto LAB_0010d6e6;
          }
LAB_0010d87f:
          lVar40 = uVar22 - 1;
          lVar35 = lVar20 + 1;
          memset((void *)((long)local_2770 + lVar38 * 4 + 4),0,lVar40 * 4);
          lVar40 = lVar38 + lVar40;
        }
      }
      lVar38 = lVar40 + 1;
      lVar20 = lVar35;
    } while (lVar40 + 4U < num_bytes);
  }
  sVar7 = *num_literals;
  sVar8 = *last_insert_len;
  uVar10 = *(undefined8 *)dist_cache;
  uVar11 = *(undefined8 *)(dist_cache + 2);
  sVar9 = *num_commands;
  lVar38 = num_bytes + 1;
  if (lVar38 == 0) {
    queue = (StartPosQueue *)0x0;
  }
  else {
    queue = (StartPosQueue *)BrotliAllocate(m,lVar38 * 0x10);
  }
  InitZopfliCostModel(m,&model,&params->dist,num_bytes);
  pfVar1 = (float *)(queue->q_[0].distance_cache + 1);
  lVar20 = lVar38;
  pfVar3 = pfVar1;
  lVar35 = 0;
  do {
    for (; lVar20 != 0; lVar20 = lVar20 + -1) {
      *(undefined4 *)&((PosData *)(pfVar3 + -3))->pos = 1;
      pfVar3[-2] = 0.0;
      pfVar3[-1] = 0.0;
      *pfVar3 = 1.7e+38;
      pfVar3 = pfVar3 + 4;
    }
    if (lVar35 == 0) {
      nodes = (ZopfliNode *)0x10db84;
      ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
    }
    else {
      sVar24 = *num_commands;
      memset(histogram_literal,0,0x400);
      memset(histogram_cmd,0,0xb00);
      memset(histogram_dist,0,0x880);
      if (sVar24 != sVar9) {
        lVar20 = 0;
        uVar23 = position - sVar8;
        do {
          uVar22 = (ulong)commands[lVar20].insert_len_;
          uVar19 = commands[lVar20].copy_len_;
          uVar5 = commands[lVar20].dist_prefix_;
          uVar6 = commands[lVar20].cmd_prefix_;
          histogram_cmd[uVar6] = histogram_cmd[uVar6] + 1;
          uVar21 = uVar23;
          uVar15 = uVar22;
          if (0x7f < uVar6) {
            histogram_dist[uVar5 & 0x3ff] = histogram_dist[uVar5 & 0x3ff] + 1;
          }
          for (; uVar15 != 0; uVar15 = uVar15 - 1) {
            histogram_literal[ringbuffer[uVar21 & ringbuffer_mask]] =
                 histogram_literal[ringbuffer[uVar21 & ringbuffer_mask]] + 1;
            uVar21 = uVar21 + 1;
          }
          uVar23 = uVar23 + uVar22 + (ulong)(uVar19 & 0x1ffffff);
          lVar20 = lVar20 + 1;
        } while (lVar20 != sVar24 - sVar9);
      }
      SetCost(histogram_literal,0x100,1,cost_literal);
      SetCost(histogram_cmd,0x2c0,0,model.cost_cmd_);
      nodes = (ZopfliNode *)0x10dae3;
      SetCost(histogram_dist,(ulong)model.distance_histogram_size,0,model.cost_dist_);
      model.min_cost_cmd_ = 1.7e+38;
      lVar20 = 0;
      do {
        if (model.cost_cmd_[lVar20] <= model.min_cost_cmd_) {
          model.min_cost_cmd_ = model.cost_cmd_[lVar20];
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x2c0);
      *model.literal_costs_ = 0.0;
      if (model.num_bytes_ != 0) {
        fVar42 = 0.0;
        sVar24 = 0;
        do {
          fVar4 = cost_literal[ringbuffer[position + sVar24 & ringbuffer_mask]];
          pfVar3 = model.literal_costs_ + sVar24;
          fVar43 = *pfVar3 + fVar42 + fVar4;
          model.literal_costs_[sVar24 + 1] = fVar43;
          sVar24 = sVar24 + 1;
          fVar42 = (fVar42 + fVar4) - (fVar43 - *pfVar3);
        } while (model.num_bytes_ != sVar24);
      }
    }
    *num_commands = sVar9;
    *num_literals = sVar7;
    *last_insert_len = sVar8;
    *(undefined8 *)dist_cache = uVar10;
    *(undefined8 *)(dist_cache + 2) = uVar11;
    uVar19 = 0x145;
    if (params->quality < 0xb) {
      uVar19 = 0x96;
    }
    *(undefined4 *)&queue->q_[0].pos = 0;
    queue->q_[0].distance_cache[1] = 0;
    histogram_cmd[0x40] = 0;
    histogram_cmd[0x41] = 0;
    if (3 < num_bytes) {
      lVar20 = 0;
      sVar24 = 0;
      do {
        sVar18 = UpdateNodes(num_bytes,position,sVar24,ringbuffer,ringbuffer_mask,params,
                             max_backward_limit,dist_cache,
                             (ulong)*(uint *)((long)local_2770 + sVar24 * 4),
                             (BackwardMatch *)((long)local_2798 + lVar20 * 8),&model,
                             (StartPosQueue *)histogram_cmd,(ZopfliNode *)queue);
        uVar23 = 0;
        if (0x3fff < sVar18) {
          uVar23 = sVar18;
        }
        uVar21 = (ulong)*(uint *)((long)local_2770 + sVar24 * 4);
        lVar20 = lVar20 + uVar21;
        if (((uVar21 == 1) &&
            (uVar14 = *(uint *)((long)local_2798 + lVar20 * 8 + -4) >> 5, uVar19 < uVar14)) &&
           (uVar23 < uVar14)) {
          uVar23 = (ulong)uVar14;
        }
        if (1 < uVar23) {
          lVar40 = uVar23 - 1;
          uVar23 = sVar24 + 4;
          do {
            sVar24 = uVar23 - 3;
            if (num_bytes <= uVar23) break;
            EvaluateNode(position,sVar24,max_backward_limit,(size_t)dist_cache,(int *)&model,
                         (ZopfliCostModel *)histogram_cmd,queue,nodes);
            lVar20 = lVar20 + (ulong)*(uint *)((long)local_2770 + uVar23 * 4 + -0xc);
            uVar23 = uVar23 + 1;
            lVar40 = lVar40 + -1;
          } while (lVar40 != 0);
        }
        uVar23 = sVar24 + 4;
        sVar24 = sVar24 + 1;
      } while (uVar23 < num_bytes);
    }
    sVar24 = ComputeShortestPathFromNodes(num_bytes,(ZopfliNode *)queue);
    *num_commands = *num_commands + sVar24;
    BrotliZopfliCreateCommands
              (num_bytes,position,max_backward_limit,(ZopfliNode *)queue,dist_cache,last_insert_len,
               params,commands,num_literals);
    bVar41 = lVar35 != 0;
    lVar20 = lVar38;
    pfVar3 = pfVar1;
    lVar35 = lVar35 + 1;
    if (bVar41) {
      BrotliFree(m,model.literal_costs_);
      model.literal_costs_ = (float *)0x0;
      BrotliFree(m,model.cost_dist_);
      model.cost_dist_ = (float *)0x0;
      BrotliFree(m,queue);
      BrotliFree(m,local_2798);
      BrotliFree(m,local_2770);
      return;
    }
  } while( true );
code_r0x0010ced0:
  uVar28 = uVar28 + 1;
  lVar35 = lVar35 + -8;
  puVar36 = puVar31 + (uVar27 & 0xfffffffffffffff8);
  uVar37 = uVar27 & 0xfffffffffffffff8;
  if (uVar27 >> 3 == uVar28) goto LAB_0010cf40;
  goto LAB_0010cec3;
code_r0x0010d0ca:
  uVar37 = uVar37 + 1;
  lVar34 = lVar34 + -8;
  if (uVar28 >> 3 == uVar37) goto code_r0x0010d0d6;
  goto LAB_0010d0bd;
code_r0x0010d0d6:
  puVar31 = puVar31 + -lVar34;
LAB_0010d22b:
  uVar28 = uVar28 & 7;
  uVar37 = uVar30;
  if (uVar28 != 0) {
    uVar29 = uVar30 | uVar28;
    do {
      uVar37 = uVar30;
      if (ringbuffer[uVar30 + uVar39 + uVar22] != *puVar31) break;
      puVar31 = puVar31 + 1;
      uVar30 = uVar30 + 1;
      uVar28 = uVar28 - 1;
      uVar37 = uVar29;
    } while (uVar28 != 0);
  }
LAB_0010d11a:
  uVar37 = uVar37 + uVar39;
  if (local_27d8 == (undefined4 *)0x0) {
    local_27d8 = (undefined4 *)0x0;
  }
  else if (uVar33 < uVar37) {
    *local_27d8 = (int)uVar26;
    local_27d8[1] = (int)uVar37 << 5;
    local_27d8 = local_27d8 + 2;
    uVar33 = uVar37;
  }
  if (uVar37 < uVar15) {
    if (ringbuffer[uVar37 + (uVar17 & ringbuffer_mask)] < ringbuffer[uVar37 + uVar22]) {
      if (0x7f < uVar27) {
        *(int *)(hasher + lVar40 * 4 + 0x80038) = (int)uVar17;
      }
      lVar40 = (uVar17 & uVar16) * 2 + 1;
      lVar34 = lVar40;
      local_2760 = uVar37;
    }
    else {
      if (0x7f < uVar27) {
        *(int *)(hasher + lVar35 * 4 + 0x80038) = (int)uVar17;
      }
      lVar35 = (uVar17 & uVar16) * 2;
      lVar34 = lVar35;
      local_2748 = uVar37;
    }
    uVar17 = (ulong)*(uint *)(hasher + lVar34 * 4 + 0x80038);
    bVar41 = true;
  }
  else if (uVar27 < 0x80) {
    bVar41 = false;
  }
  else {
    *(undefined4 *)(hasher + lVar40 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar17 & uVar16) * 8 + 0x80038);
    uVar12 = *(undefined4 *)(hasher + (uVar17 & uVar16) * 8 + 0x8003c);
LAB_0010d04c:
    *(undefined4 *)(hasher + lVar35 * 4 + 0x80038) = uVar12;
LAB_0010d054:
    bVar41 = false;
  }
  lVar32 = lVar32 + -1;
  if (!bVar41) goto LAB_0010d26c;
  goto LAB_0010d00e;
code_r0x0010d51e:
  uVar37 = uVar37 + 1;
  lVar40 = lVar40 + -8;
  if (uVar28 >> 3 == uVar37) goto code_r0x0010d52a;
  goto LAB_0010d511;
code_r0x0010d52a:
  puVar31 = puVar31 + -lVar40;
LAB_0010d60a:
  uVar28 = uVar28 & 7;
  uVar37 = uVar30;
  if (uVar28 != 0) {
    uVar29 = uVar30 | uVar28;
    do {
      uVar37 = uVar30;
      if (ringbuffer[uVar30 + uVar26 + uVar17] != *puVar31) break;
      puVar31 = puVar31 + 1;
      uVar30 = uVar30 + 1;
      uVar28 = uVar28 - 1;
      uVar37 = uVar29;
    } while (uVar28 != 0);
  }
LAB_0010d56a:
  uVar37 = uVar37 + uVar26;
  if (uVar37 < 0x80) {
    uVar26 = (uVar39 & uVar21) * 2;
    if (ringbuffer[uVar37 + (uVar39 & ringbuffer_mask)] < ringbuffer[uVar37 + uVar17]) {
      *(int *)(hasher + uVar33 * 4 + 0x80038) = (int)uVar39;
      uVar26 = uVar26 | 1;
      uVar33 = uVar26;
      local_27b0 = uVar37;
    }
    else {
      *(int *)(hasher + uVar16 * 4 + 0x80038) = (int)uVar39;
      uVar16 = uVar26;
      local_27c8 = uVar37;
    }
    uVar39 = (ulong)*(uint *)(hasher + uVar26 * 4 + 0x80038);
    bVar41 = true;
  }
  else {
    *(undefined4 *)(hasher + uVar33 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar39 & uVar21) * 8 + 0x80038);
    uVar12 = *(undefined4 *)(hasher + (uVar39 & uVar21) * 8 + 0x8003c);
LAB_0010d49f:
    *(undefined4 *)(hasher + uVar16 * 4 + 0x80038) = uVar12;
    bVar41 = false;
  }
  lVar35 = lVar35 + -1;
  if (!bVar41) goto LAB_0010d639;
  goto LAB_0010d46c;
LAB_0010d639:
  uVar23 = uVar23 + 8;
  if (uVar27 <= uVar23) goto LAB_0010d64b;
  goto LAB_0010d41d;
code_r0x0010d764:
  uVar37 = uVar37 + 1;
  lVar40 = lVar40 + -8;
  if (uVar39 >> 3 == uVar37) goto code_r0x0010d770;
  goto LAB_0010d757;
code_r0x0010d770:
  puVar31 = puVar31 + -lVar40;
LAB_0010d843:
  uVar39 = uVar39 & 7;
  uVar37 = uVar28;
  if (uVar39 != 0) {
    uVar30 = uVar28 | uVar39;
    do {
      uVar37 = uVar28;
      if (ringbuffer[uVar28 + uVar17 + uVar33] != *puVar31) break;
      puVar31 = puVar31 + 1;
      uVar28 = uVar28 + 1;
      uVar39 = uVar39 - 1;
      uVar37 = uVar30;
    } while (uVar39 != 0);
  }
LAB_0010d7af:
  uVar37 = uVar37 + uVar17;
  if (uVar37 < 0x80) {
    uVar17 = (uVar26 & uVar23) * 2;
    if (ringbuffer[uVar37 + (uVar26 & ringbuffer_mask)] < ringbuffer[uVar37 + uVar33]) {
      *(int *)(hasher + uVar16 * 4 + 0x80038) = (int)uVar26;
      uVar17 = uVar17 | 1;
      uVar16 = uVar17;
      local_27b0 = uVar37;
    }
    else {
      *(int *)(hasher + uVar21 * 4 + 0x80038) = (int)uVar26;
      uVar21 = uVar17;
      local_27c8 = uVar37;
    }
    uVar26 = (ulong)*(uint *)(hasher + uVar17 * 4 + 0x80038);
    bVar41 = true;
  }
  else {
    *(undefined4 *)(hasher + uVar16 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar26 & uVar23) * 8 + 0x80038);
    uVar12 = *(undefined4 *)(hasher + (uVar26 & uVar23) * 8 + 0x8003c);
LAB_0010d6e6:
    *(undefined4 *)(hasher + uVar21 * 4 + 0x80038) = uVar12;
    bVar41 = false;
  }
  lVar35 = lVar35 + -1;
  if (!bVar41) goto LAB_0010d871;
  goto LAB_0010d6b3;
LAB_0010d871:
  uVar27 = uVar27 + 1;
  if (uVar15 <= uVar27) goto LAB_0010d87f;
  goto LAB_0010d664;
}

Assistant:

void BrotliCreateHqZopfliBackwardReferences(MemoryManager* m,
    size_t num_bytes, size_t position, const uint8_t* ringbuffer,
    size_t ringbuffer_mask, const BrotliEncoderParams* params,
    HasherHandle hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel model;
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  size_t gap = 0;
  size_t shadow_matches = 0;
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10 + shadow_matches);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(hasher,
        &params->dictionary, ringbuffer, ringbuffer_mask, pos, max_length,
        max_distance, gap, params, &matches[cur_match_pos + shadow_matches]);
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      BROTLI_DCHECK(BackwardMatchLength(&matches[j]) <=
          BackwardMatchLength(&matches[j + 1]));
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m)) return;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          &model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(&model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, max_backward_limit, gap, dist_cache,
        &model, num_matches, matches, nodes);
    BrotliZopfliCreateCommands(num_bytes, position, max_backward_limit,
        nodes, dist_cache, last_insert_len, params, commands, num_literals);
  }
  CleanupZopfliCostModel(m, &model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}